

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O2

int __thiscall TextFile::close(TextFile *this,int __fd)

{
  bool bVar1;
  undefined3 extraout_var;
  int iVar2;
  
  bVar1 = isOpen(this);
  iVar2 = CONCAT31(extraout_var,bVar1);
  if ((bVar1) && (this->fromMemory == false)) {
    bufDrainWrite(this);
    iVar2 = std::fstream::close();
  }
  this->bufPos = 0;
  return iVar2;
}

Assistant:

void TextFile::close()
{
	if (isOpen() && !fromMemory)
	{
		bufDrainWrite();
		stream.close();
	}
	bufPos = 0;
}